

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O1

bool __thiscall
Hospital::Id_Validate_for_fire
          (Hospital *this,vector<Nurse,_std::allocator<Nurse>_> *All_Of_Nurses,string *id)

{
  pointer pcVar1;
  string *psVar2;
  long lVar3;
  pointer pDVar4;
  char *pcVar5;
  Hospital *this_00;
  bool bVar6;
  string id_1;
  string local_98 [2];
  pointer local_58;
  pointer local_50;
  undefined1 local_48 [40];
  
  this_00 = (Hospital *)local_98;
  if (id->_M_string_length == 8) {
    pcVar1 = (id->_M_dataplus)._M_p;
    local_58 = (pointer)local_48;
    std::__cxx11::string::_M_construct<char*>((string *)&local_58,pcVar1,pcVar1 + 8);
    bVar6 = local_50 == (pointer)0x0;
    if (!bVar6) {
      if ((byte)(*(char *)&(local_58->super_Human).Id._M_dataplus._M_p - 0x30U) < 10) {
        pDVar4 = (pointer)0x0;
        do {
          if (*(char *)&(local_58->super_Human).Id._M_dataplus._M_p == '0') goto LAB_0011dea4;
          if ((pointer)((long)&local_50[-1].doctor_all_ino.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7U) == pDVar4) {
            bVar6 = true;
            goto LAB_0011dea6;
          }
          pcVar5 = (undefined1 *)((long)&(local_58->super_Human).Id._M_dataplus._M_p + 1) +
                   (long)pDVar4;
          pDVar4 = (pointer)((long)&(pDVar4->super_Human).Id._M_dataplus._M_p + 1);
        } while ((byte)(*pcVar5 - 0x30U) < 10);
        bVar6 = local_50 <= pDVar4;
      }
      else {
LAB_0011dea4:
        bVar6 = false;
      }
    }
LAB_0011dea6:
    if (local_58 != (pointer)local_48) {
      operator_delete(local_58,(ulong)(local_48._0_8_ + 1));
    }
    if (bVar6) {
      std::vector<Nurse,_std::allocator<Nurse>_>::vector
                ((vector<Nurse,_std::allocator<Nurse>_> *)(local_48 + 0x10),All_Of_Nurses);
      pcVar1 = (id->_M_dataplus)._M_p;
      local_98[0]._M_dataplus._M_p = (pointer)&local_98[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_98,pcVar1,pcVar1 + id->_M_string_length);
      bVar6 = Existence_Of_Id_For_Nurses
                        (this_00,(vector<Nurse,_std::allocator<Nurse>_> *)(local_48 + 0x10),local_98
                        );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
        operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
      }
      std::vector<Nurse,_std::allocator<Nurse>_>::~vector
                ((vector<Nurse,_std::allocator<Nurse>_> *)(local_48 + 0x10));
      if (bVar6) {
        psVar2 = (string *)__cxa_allocate_exception(0x20);
        *(string **)psVar2 = psVar2 + 0x10;
        pcVar1 = (id->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>(psVar2,pcVar1,pcVar1 + id->_M_string_length);
        __cxa_throw(psVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
      lVar3 = 0x1e;
      pcVar5 = "This id already not exists !!!";
    }
    else {
      lVar3 = 0x21;
      pcVar5 = "Your id must consist of numbers !";
    }
  }
  else {
    lVar3 = 0x23;
    pcVar5 = "Your id lenght must be equal to 8 !";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,lVar3);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
  std::ostream::put('h');
  std::ostream::flush();
  return false;
}

Assistant:

bool Hospital :: Id_Validate_for_fire(vector<Nurse> All_Of_Nurses,string id){
    try {
        if(id.length() != 8) {
            cout <<"Your id lenght must be equal to 8 !"<<endl;
            return false;
        }
        else if(!validate_String_Must_Be_Number(id)) {
            cout <<"Your id must consist of numbers !"<<endl;
            return false;
        }
        else if(! Existence_Of_Id_For_Nurses(All_Of_Nurses ,id)){
            cout << "This id already not exists !!!"<<endl;   ///add bool func to search in file and check existence of id
            return false;
        }
        else throw id;
    }
    catch(string id) {
        cout << "your id entered successfully ."<<endl;
        return true;
    }
}